

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

bool BackwardPass::UpdateImplicitCallBailOutKind
               (Instr *instr,bool needsBailOutOnImplicitCall,bool needsLazyBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  BailOutKind BVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  BailOutInfo *pBVar7;
  char *message;
  char *error;
  uint lineNumber;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b5,"(instr)","instr");
    if (!bVar2) goto LAB_003dc08d;
    *puVar6 = 0;
  }
  if ((instr->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b6,"(instr->HasBailOutInfo())","instr->HasBailOutInfo()");
    if (!bVar2) goto LAB_003dc08d;
    *puVar6 = 0;
  }
  BVar3 = IR::Instr::GetBailOutKind(instr);
  if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x9b7,"(BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))",
                       "BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind())");
    if (!bVar2) goto LAB_003dc08d;
    *puVar6 = 0;
  }
  BVar3 = IR::Instr::GetBailOutKind(instr);
  BVar4 = IR::Instr::GetBailOutKind(instr);
  if (needsLazyBailOut) {
    if (BVar3 != (BVar4 | LazyBailOut)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      error = 
      "(!needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(instr->GetBailOutKind()))"
      ;
      message = 
      "The lazy bailout bit should be present at this point. We might have removed it incorrectly.";
      lineNumber = 0x9bf;
LAB_003dbf1c:
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,lineNumber,error,message);
      if (!bVar2) goto LAB_003dc08d;
      *puVar6 = 0;
    }
  }
  else if (BVar3 != (BVar4 & ~LazyBailOut)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    error = 
    "(needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind()))"
    ;
    message = 
    "We should have removed all lazy bailout bit at this point if we decided that we wouldn\'t need it"
    ;
    lineNumber = 0x9bb;
    goto LAB_003dbf1c;
  }
  BVar4 = IR::Instr::GetBailOutKind(instr);
  BVar3 = BVar4;
  if ((BVar4 >> 0x1e & 1) != 0) {
    BVar3 = BVar4 & ~BailOutMarkTempObject;
    IR::Instr::SetBailOutKind(instr,BVar3);
  }
  if (needsBailOutOnImplicitCall) {
    if ((needsLazyBailOut) &&
       (bVar2 = IR::Instr::CanChangeFieldValueWithoutImplicitCall(instr), !bVar2)) {
      IR::Instr::ClearLazyBailOut(instr);
    }
  }
  else {
    IR::Instr::ClearLazyBailOut(instr);
    if ((instr->field_0x38 & 0x10) == 0) {
      return true;
    }
    BVar5 = IR::Instr::GetBailOutKindNoBits(instr);
    pBVar7 = IR::Instr::GetBailOutInfo(instr);
    if (pBVar7->canDeadStore != false) {
      if (BVar3 - BVar5 == BailOutInvalid) {
        return false;
      }
      IR::Instr::SetBailOutKind(instr,BVar3 - BVar5);
      return true;
    }
    if ((BVar4 >> 0x1e & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x9ea,"(hasMarkTempObject)","hasMarkTempObject");
      if (!bVar2) goto LAB_003dc08d;
      *puVar6 = 0;
    }
    if (BVar5 != BailOutOnImplicitCallsPreOp) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x9ec,"(bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp)",
                         "bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp");
      if (!bVar2) {
LAB_003dc08d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
  }
  return true;
}

Assistant:

bool
BackwardPass::UpdateImplicitCallBailOutKind(IR::Instr* const instr, bool needsBailOutOnImplicitCall, bool needsLazyBailOut)
{
    Assert(instr);
    Assert(instr->HasBailOutInfo());
    Assert(BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()));
    AssertMsg(
        needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithoutLazyBailOut(instr->GetBailOutKind()),
        "We should have removed all lazy bailout bit at this point if we decided that we wouldn't need it"
    );
    AssertMsg(
        !needsLazyBailOut || instr->GetBailOutKind() == BailOutInfo::WithLazyBailOut(instr->GetBailOutKind()),
        "The lazy bailout bit should be present at this point. We might have removed it incorrectly."
    );

    IR::BailOutKind bailOutKindWithBits = instr->GetBailOutKind();

    const bool hasMarkTempObject = bailOutKindWithBits & IR::BailOutMarkTempObject;

    // Firstly, we remove the mark temp object bit, as it is not needed after the dead store pass.
    // We will later skip removing BailOutOnImplicitCalls when there is a mark temp object bit regardless
    // of `needsBailOutOnImplicitCall`.
    if (hasMarkTempObject)
    {
        bailOutKindWithBits &= ~IR::BailOutMarkTempObject;
        instr->SetBailOutKind(bailOutKindWithBits);
    }

    if (needsBailOutOnImplicitCall)
    {
        // We decided that BailOutOnImplicitCall is needed. So lazy bailout is unnecessary
        // because we are already protected from potential side effects unless the operation
        // itself can change fields' values (StFld/StElem).
        if (needsLazyBailOut && !instr->CanChangeFieldValueWithoutImplicitCall())
        {
            instr->ClearLazyBailOut();
        }

        return true;
    }
    else
    {
        // `needsBailOutOnImplicitCall` also captures our intention to keep BailOutOnImplicitCalls
        // because we want to do fixed field lazy bailout optimization. So if we don't need them,
        // just remove our lazy bailout.
        instr->ClearLazyBailOut();
        if (!instr->HasBailOutInfo())
        {
            return true;
        }
    }

    const IR::BailOutKind bailOutKindWithoutBits = instr->GetBailOutKindNoBits();
    if (!instr->GetBailOutInfo()->canDeadStore)
    {
        // revisit if canDeadStore is used for anything other than BailOutMarkTempObject
        Assert(hasMarkTempObject);
        // Don't remove the implicit call pre op bailout for mark temp object.
        Assert(bailOutKindWithoutBits == IR::BailOutOnImplicitCallsPreOp);
        return true;
    }

    // At this point, we don't need the bail on implicit calls.
    // Simply use the bailout kind bits as our new bailout kind.
    IR::BailOutKind newBailOutKind = bailOutKindWithBits - bailOutKindWithoutBits;

    if (newBailOutKind == IR::BailOutInvalid)
    {
        return false;
    }

    instr->SetBailOutKind(newBailOutKind);
    return true;
}